

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

bool __thiscall Clasp::MovingAvg::push(MovingAvg *this,uint32 val)

{
  uint64 numSeen;
  bool bVar1;
  uint uVar2;
  uint in_ESI;
  MovingAvg *in_RDI;
  double dVar3;
  double alpha;
  double in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  uint32 sample;
  uint32 uVar4;
  
  if ((*(uint *)&in_RDI->field_0x14 & 0x1fffffff) == 0) {
    numSeen = (in_RDI->extra_).num;
    (in_RDI->extra_).sma = (uint32 *)(numSeen + 1);
    dVar3 = cma(in_RDI->avg_,(double)in_ESI,numSeen);
    in_RDI->avg_ = dVar3;
  }
  else if ((*(uint *)&in_RDI->field_0x14 >> 0x1e & 1) == 0) {
    dVar3 = in_RDI->avg_;
    sample = (uint32)((in_RDI->extra_).num >> 0x20);
    uVar2 = *(uint *)&in_RDI->field_0x14 & 0x1fffffff;
    uVar4 = in_RDI->pos_;
    valid(in_RDI);
    dVar3 = sma((double)CONCAT44(uVar4,uVar2),sample,
                (uint32 *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),(uint32)((ulong)dVar3 >> 0x20),
                SUB84(dVar3,0),SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
    in_RDI->avg_ = dVar3;
  }
  else {
    bVar1 = valid(in_RDI);
    if (bVar1) {
      dVar3 = ema(in_RDI->avg_,(double)in_ESI,(in_RDI->extra_).alpha);
      in_RDI->avg_ = dVar3;
    }
    else {
      if (*(int *)&in_RDI->field_0x14 < 0) {
        dVar3 = in_RDI->avg_;
        alpha = smoothAlpha(in_stack_ffffffffffffffc0,(uint32)((ulong)dVar3 >> 0x20));
        dVar3 = ema(dVar3,(double)in_ESI,alpha);
      }
      else {
        dVar3 = cma(in_RDI->avg_,(double)in_ESI,(ulong)in_RDI->pos_);
      }
      in_RDI->avg_ = dVar3;
    }
  }
  uVar2 = in_RDI->pos_ + 1;
  in_RDI->pos_ = uVar2;
  if (uVar2 == (*(uint *)&in_RDI->field_0x14 & 0x1fffffff)) {
    in_RDI->pos_ = 0;
    *(uint *)&in_RDI->field_0x14 = *(uint *)&in_RDI->field_0x14 & 0xdfffffff | 0x20000000;
  }
  bVar1 = valid(in_RDI);
  return bVar1;
}

Assistant:

bool push(uint32 val) {
		if      (!win_)   { avg_ = cma(avg_, val, extra_.num++); }
		else if (!ema_)   { avg_ = sma(avg_, val, extra_.sma, win_, pos_, valid()); }
		else if (valid()) { avg_ = ema(avg_, val, extra_.alpha); }
		else              { avg_ = smooth_ ? ema(avg_, val, smoothAlpha(extra_.alpha, pos_)) : cma(avg_, val, pos_); }
		if (++pos_ == win_) { pos_ = 0; full_ = 1; }
		return valid();
	}